

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Mio_LibraryHashGates(Mio_Library_t *pLib)

{
  st__table *psVar1;
  Mio_Gate_t *local_18;
  Mio_Gate_t *pGate;
  Mio_Library_t *pLib_local;
  
  local_18 = Mio_LibraryReadGates(pLib);
  while( true ) {
    if (local_18 == (Mio_Gate_t *)0x0) {
      if (pLib->tName2Gate != (st__table *)0x0) {
        st__free_table(pLib->tName2Gate);
      }
      psVar1 = st__init_table(strcmp,st__strhash);
      pLib->tName2Gate = psVar1;
      for (local_18 = Mio_LibraryReadGates(pLib); local_18 != (Mio_Gate_t *)0x0;
          local_18 = Mio_GateReadNext(local_18)) {
        st__insert(pLib->tName2Gate,local_18->pName,(char *)local_18);
      }
      return;
    }
    if (local_18->pTwin != (Mio_Gate_t *)0x0) break;
    local_18 = Mio_GateReadNext(local_18);
  }
  printf("Gates with multiple outputs are not supported.\n");
  return;
}

Assistant:

void Mio_LibraryHashGates( Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate;    
    Mio_LibraryForEachGate( pLib, pGate )
        if ( pGate->pTwin )
        {
            printf( "Gates with multiple outputs are not supported.\n" );
            return;
        }
    if ( pLib->tName2Gate )
        st__free_table( pLib->tName2Gate );
    pLib->tName2Gate = st__init_table(strcmp, st__strhash);
    Mio_LibraryForEachGate( pLib, pGate )
        st__insert( pLib->tName2Gate, pGate->pName, (char *)pGate );
}